

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O0

void lace_barrier(void)

{
  int wait;
  
  LOCK();
  UNLOCK();
  if (n_workers != lace_bar.count + 1U) {
    do {
    } while( true );
  }
  lace_bar.wait = 1 - lace_bar.wait;
  lace_bar.count = 0;
  LOCK();
  lace_bar.leaving = n_workers - 1;
  UNLOCK();
  return;
}

Assistant:

void
lace_barrier()
{
    int wait = lace_bar.wait;
    if ((int)n_workers == 1+(atomic_fetch_add_explicit(&lace_bar.count, 1, memory_order_relaxed))) {
        // we know for sure no other thread can be here
        atomic_store_explicit(&lace_bar.count, 0, memory_order_relaxed);
        atomic_store_explicit(&lace_bar.leaving, n_workers, memory_order_relaxed);
        // flip wait
        atomic_store_explicit(&lace_bar.wait, 1-wait, memory_order_relaxed);
    } else {
        while (wait == lace_bar.wait) {} // wait
    }
    lace_bar.leaving -= 1;
}